

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

bool __thiscall lan::db::init<int>(db *this,db_bit *context,string *name,int value,db_bit_type type)

{
  pointer pcVar1;
  bool bVar2;
  db_bit *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  this->data = context;
  this_00 = (db_bit *)operator_new(0x50);
  (this_00->key)._M_dataplus._M_p = (pointer)&(this_00->key).field_2;
  (this_00->key)._M_string_length = 0;
  (this_00->key).field_2._M_local_buf[0] = '\0';
  this_00->data = (void *)0x0;
  this_00->pre = (db_bit *)0x0;
  this_00->nex = (db_bit *)0x0;
  this_00->lin = (db_bit *)0x0;
  this_00->con = (db_bit *)0x0;
  context->lin = this_00;
  if ((int)type < 9) {
    paVar3 = &local_50.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    bVar2 = set_bit<int>(this,context,this_00,&local_50,type,value);
    _Var4._M_p = local_50._M_dataplus._M_p;
  }
  else {
    paVar3 = &local_60;
    pcVar1 = (name->_M_dataplus)._M_p;
    local_70[0] = paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + name->_M_string_length);
    db_bit::~db_bit(this_00);
    std::__cxx11::string::_M_assign((string *)this_00);
    this_00->type = type;
    this_00->con = context;
    bVar2 = true;
    _Var4._M_p = (pointer)local_70[0];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar3) {
    operator_delete(_Var4._M_p,paVar3->_M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool init(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            data->lin = new db_bit;
            return ((type < lan::Array) ? set_bit(data, data->lin, name, type, value) : set_bit(data, data->lin, name, type));
        }